

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

BinarySection *
flatbuffers::anon_unknown_45::GenerateMissingSection
          (BinarySection *__return_storage_ptr__,uint64_t offset,uint64_t length,uint8_t *binary)

{
  bool bVar1;
  string *this;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *this_00;
  allocator<char> local_2d9;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  BinaryRegionCommentType local_298;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  size_t local_250;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_248;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_228;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  BinaryRegion local_1b0;
  BinaryRegionComment local_110;
  BinaryRegionComment local_98;
  
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = IsNonZeroRegion(offset,length,binary);
  if (bVar1) {
    local_2c0._0_4_ = OK;
    local_2b8._M_p = (pointer)&local_2a8;
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250 = 0;
    local_298 = Unknown;
    if (length < 8) {
      std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",(allocator<char> *)&local_1b0)
      ;
      local_2c0._0_4_ = WARN_CORRUPTED_PADDING;
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      this = local_1f0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_1d0,"",(allocator<char> *)&local_1b0)
      ;
      local_2c0._0_4_ = WARN_NO_REFERENCES;
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      this = local_1d0;
    }
    std::__cxx11::string::~string(this);
    BinaryRegionComment::BinaryRegionComment(&local_98,(BinaryRegionComment *)local_2c0);
    MakeBinaryRegion(&local_1b0,offset,length,Unknown,length,0,&local_98);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&regions,&local_1b0);
    BinaryRegionComment::~BinaryRegionComment(&local_1b0.comment);
    BinaryRegionComment::~BinaryRegionComment(&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"no known references",&local_2d9);
    local_228.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_228.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_228.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(__return_storage_ptr__,(string *)&local_1b0,Unknown,&local_228);
    this_00 = &local_228;
  }
  else {
    local_2b8._M_p = (pointer)&local_2a8;
    local_2c0._0_4_ = OK;
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250 = 0;
    local_298 = Padding;
    if (7 < length) {
      std::__cxx11::string::string<std::allocator<char>>(local_210,"",(allocator<char> *)&local_1b0)
      ;
      local_2c0._0_4_ = WARN_PADDING_LENGTH;
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      std::__cxx11::string::~string(local_210);
    }
    BinaryRegionComment::BinaryRegionComment(&local_110,(BinaryRegionComment *)local_2c0);
    MakeBinaryRegion(&local_1b0,offset,length,Uint8,length,0,&local_110);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&regions,&local_1b0);
    BinaryRegionComment::~BinaryRegionComment(&local_1b0.comment);
    BinaryRegionComment::~BinaryRegionComment(&local_110);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_2d9);
    local_248.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_248.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(__return_storage_ptr__,(string *)&local_1b0,Padding,&local_248);
    this_00 = &local_248;
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (this_00);
  std::__cxx11::string::~string((string *)&local_1b0);
  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_2c0);
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&regions);
  return __return_storage_ptr__;
}

Assistant:

static BinarySection GenerateMissingSection(const uint64_t offset,
                                            const uint64_t length,
                                            const uint8_t *const binary) {
  std::vector<BinaryRegion> regions;

  // Check if the region is all zeros or not, as that can tell us if it is
  // padding or not.
  if (IsNonZeroRegion(offset, length, binary)) {
    // Some of the padding bytes are non-zero, so this might be an unknown
    // section of the binary.
    // TODO(dbaileychess): We could be a bit smarter with different sized
    // alignments. For now, the 8 byte check encompasses all the smaller
    // alignments.
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::Unknown;
    if (length >= 8) {
      SetError(comment, BinaryRegionStatus::WARN_NO_REFERENCES);
    } else {
      SetError(comment, BinaryRegionStatus::WARN_CORRUPTED_PADDING);
    }

    regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                       BinaryRegionType::Unknown, length, 0,
                                       comment));

    return MakeBinarySection("no known references", BinarySectionType::Unknown,
                             std::move(regions));
  }

  BinaryRegionComment comment;
  comment.type = BinaryRegionCommentType::Padding;
  if (length >= 8) {
    SetError(comment, BinaryRegionStatus::WARN_PADDING_LENGTH);
  }

  // This region is most likely padding.
  regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                     BinaryRegionType::Uint8, length, 0,
                                     comment));

  return MakeBinarySection("", BinarySectionType::Padding, std::move(regions));
}